

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::FuncFrame::finalize(FuncFrame *this)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  Error EVar4;
  uint32_t uVar5;
  byte *pbVar6;
  uint *puVar7;
  InstHints *pIVar8;
  uint uVar9;
  uint uVar10;
  FuncAttributes FVar11;
  int iVar12;
  FuncAttributes *in_RDI;
  uint32_t v;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  uint32_t saveRestoreSizes [2];
  uint32_t saRegId;
  uint32_t kLr;
  uint32_t kFp;
  uint32_t kSp;
  bool hasDA;
  bool hasFP;
  uint32_t stackAlignment;
  uint32_t returnAddressSize;
  uint32_t vectorSize;
  uint32_t registerSize;
  ArchTraits *archTraits;
  char *in_stack_00000190;
  int in_stack_0000019c;
  char *in_stack_000001a0;
  RegGroup *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined1 local_23a;
  undefined1 local_239;
  uint local_234;
  FuncAttributes local_220;
  char local_21b;
  char local_21a;
  undefined1 local_219;
  undefined1 *local_218;
  int local_20c [2];
  undefined1 local_201;
  uint local_200;
  undefined1 local_1fa;
  undefined1 local_1f9;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  byte local_1ea;
  byte local_1e9;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1dd;
  uint local_1dc;
  undefined1 local_1d5;
  uint local_1d4;
  byte *local_1d0;
  undefined1 local_1ba;
  undefined1 local_1b9;
  byte *local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a1;
  undefined1 *local_1a0;
  undefined1 local_191;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  uint *local_170;
  uint *local_168;
  uint *local_160;
  byte *local_140;
  undefined1 local_131;
  FuncAttributes *local_130;
  byte *local_128;
  byte *local_120;
  byte *local_108;
  byte *local_100;
  uint local_f0;
  FuncAttributes local_ec;
  uint local_e8;
  FuncAttributes local_e4;
  uint32_t local_e0;
  int local_dc;
  RegMask local_d8;
  char local_d1;
  byte *local_d0;
  undefined4 local_b4;
  RegMask *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  FuncAttributes *local_68;
  undefined1 *local_60;
  byte *local_58;
  byte *local_50;
  undefined4 local_44;
  undefined4 local_34;
  InstHints local_22;
  char local_21;
  byte *local_20;
  undefined4 local_14;
  RegMask local_4;
  
  local_1ba = (undefined1)in_RDI[1];
  if (local_1ba == kNoAttributes || kHasPreservedFP < (byte)local_1ba) {
    EVar4 = DebugUtils::errored(4);
    return EVar4;
  }
  local_1b9 = (undefined1)in_RDI[1];
  local_1d0 = _archTraits + (ulong)(byte)local_1b9 * 0xd8;
  local_1d5 = 0;
  pbVar6 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                      in_stack_fffffffffffffd98);
  local_1d4 = (uint)*pbVar6;
  local_1dd = 1;
  pbVar6 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                      in_stack_fffffffffffffd98);
  local_1dc = (uint)*pbVar6;
  local_140 = local_1d0;
  if (local_1d0[2] == 0xff) {
    local_234 = local_1d4;
  }
  else {
    local_234 = 0;
  }
  local_1e4 = local_234;
  local_1e8 = (uint)*(byte *)((long)in_RDI + 0xd);
  local_120 = (byte *)((long)in_RDI + 9);
  local_128 = (byte *)((long)in_RDI + 0xb);
  local_130 = in_RDI + 3;
  if (*local_120 < *local_128) {
    local_239 = *local_128;
  }
  else {
    local_239 = *local_120;
  }
  local_131 = local_239;
  local_60 = &local_131;
  if ((byte)local_239 < (byte)(char)*local_130) {
    local_23a = (undefined1)*local_130;
  }
  else {
    local_23a = local_239;
  }
  local_68 = local_130;
  local_58 = local_128;
  local_50 = local_120;
  if (local_1e8 != (byte)local_23a) {
    DebugUtils::assertionFailed(in_stack_000001a0,in_stack_0000019c,in_stack_00000190);
  }
  local_34 = 0x10;
  local_1e9 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                        (*in_RDI,kHasPreservedFP);
  local_1ea = *(byte *)((long)in_RDI + 10) <= *(byte *)((long)in_RDI + 0xd);
  local_1b8 = local_1d0;
  local_1f0 = (uint)*local_1d0;
  local_108 = local_1d0;
  bVar3 = local_1d0[1];
  local_1f4 = (uint)bVar3;
  local_100 = local_1d0;
  local_1f8 = (uint)local_1d0[2];
  if ((bool)local_1e9) {
    local_160 = &local_1f4;
    local_1f9 = 0;
    local_80 = local_160;
    puVar7 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98);
    *puVar7 = 1 << (bVar3 & 0x1f) | *puVar7;
    if (local_1f8 != 0xff) {
      local_168 = &local_1f8;
      bVar3 = (byte)local_1f8;
      local_1fa = 0;
      local_78 = local_168;
      puVar7 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         ((Array<unsigned_int,_4UL> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd98);
      *puVar7 = 1 << (bVar3 & 0x1f) | *puVar7;
    }
  }
  local_200 = (uint)*(byte *)((long)in_RDI + 6);
  if (local_200 == 0xff) {
    local_200 = local_1f0;
  }
  if (((local_1ea & 1) != 0) && (local_200 == local_1f0)) {
    local_200 = local_1f4;
  }
  if (local_200 != local_1f0) {
    local_170 = &local_200;
    bVar3 = (byte)local_200;
    local_201 = 0;
    local_70 = local_170;
    puVar7 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98);
    *puVar7 = 1 << (bVar3 & 0x1f) | *puVar7;
  }
  *(byte *)((long)in_RDI + 5) = (byte)local_1f0;
  *(byte *)((long)in_RDI + 6) = (byte)local_200;
  memset(local_20c,0,8);
  local_218 = &local_219;
  local_1a1 = 0;
  local_21a = '\0';
  local_191 = 4;
  local_21b = '\x04';
  local_1b0 = local_218;
  local_1a0 = local_218;
  while( true ) {
    local_188 = &local_21a;
    local_190 = &local_21b;
    if (local_21a == local_21b) break;
    local_180 = &local_21a;
    cVar1 = local_21a;
    local_d8 = savedRegs((FuncFrame *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                         (RegGroup)((uint)in_stack_fffffffffffffda4 >> 0x18));
    local_88 = &local_d8;
    uVar9 = local_d8 - (local_d8 >> 1 & 0x55555555);
    uVar9 = (uVar9 & 0x33333333) + (uVar9 >> 2 & 0x33333333);
    in_stack_fffffffffffffda8 = (uVar9 + (uVar9 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18;
    local_4 = local_d8;
    uVar5 = saveRestoreRegSize((FuncFrame *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                               (RegGroup)((uint)in_stack_fffffffffffffda4 >> 0x18));
    in_stack_fffffffffffffdac = in_stack_fffffffffffffda8 * uVar5;
    local_e0 = saveRestoreAlignment
                         ((FuncFrame *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                          ,(RegGroup)((uint)in_stack_fffffffffffffda4 >> 0x18));
    uVar9 = in_stack_fffffffffffffdac + (local_e0 - 1);
    uVar10 = local_e0 - 1;
    local_d0 = local_1d0;
    local_20 = local_1d0;
    local_22 = kPushPop;
    local_dc = in_stack_fffffffffffffdac;
    local_d1 = cVar1;
    local_21 = cVar1;
    pIVar8 = Support::Array<asmjit::v1_14::InstHints,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<asmjit::v1_14::InstHints,_4UL> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98);
    bVar2 = Support::test<asmjit::v1_14::InstHints,asmjit::v1_14::InstHints>(*pIVar8,local_22);
    bVar3 = (bVar2 ^ 0xffU) & 1;
    local_20c[bVar3] = (uVar9 & (uVar10 ^ 0xffffffff)) + local_20c[bVar3];
    local_178 = &local_21a;
    local_21a = local_21a + '\x01';
  }
  *(short *)(in_RDI + 0x16) = (short)local_20c[0];
  *(short *)((long)in_RDI + 0x5a) = (short)local_20c[1];
  local_e4 = in_RDI[4];
  local_e8 = local_1e8;
  FVar11 = local_e4 + (local_1e8 - 1) & (local_1e8 - kHasVarArgs ^ ~kNoAttributes);
  in_RDI[7] = FVar11;
  FVar11 = in_RDI[5] + FVar11;
  local_220 = FVar11;
  if ((local_1dc <= local_1e8) && (*(short *)((long)in_RDI + 0x5a) != 0)) {
    local_b4 = 0x40;
    local_14 = 0x40;
    *in_RDI = *in_RDI | kAlignedVecSR;
    local_f0 = local_1dc;
    local_220 = FVar11 + (local_1dc - 1) & (local_1dc - kHasVarArgs ^ ~kNoAttributes);
    local_ec = FVar11;
  }
  in_RDI[0x18] = local_220;
  local_220 = *(ushort *)((long)in_RDI + 0x5a) + local_220;
  if (((local_1ea & 1) == 0) || ((local_1e9 & 1) != 0)) {
    in_RDI[8] = ~kNoAttributes;
  }
  else {
    in_RDI[8] = local_220;
    local_220 = local_1d4 + local_220;
  }
  if (local_220 == kNoAttributes) {
    local_44 = 0x20;
    bVar2 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                      (*in_RDI,kHasFuncCalls);
    if ((!bVar2) && (local_1e4 != 0)) goto LAB_0013f1d5;
  }
  iVar12 = local_220 + (ushort)(short)in_RDI[0x16] + local_1e4;
  local_220 = ((iVar12 + (local_1e8 - 1) & (local_1e8 - 1 ^ 0xffffffff)) - iVar12) + local_220;
LAB_0013f1d5:
  in_RDI[0x17] = local_220;
  in_RDI[0xb] = local_220;
  local_220 = (ushort)(short)in_RDI[0x16] + local_220;
  in_RDI[6] = local_220;
  if (local_1d0[2] == 0xff) {
    local_220 = local_1d4 + local_220;
  }
  if ((local_1ea & 1) != 0) {
    in_RDI[0xb] = in_RDI[0xb] + (local_1e8 - 1) & (local_1e8 - kHasVarArgs ^ ~kNoAttributes);
  }
  if ((local_1ea & 1) != 0) {
    local_220 = ~kNoAttributes;
  }
  in_RDI[9] = local_220;
  if ((local_1e9 & 1) == 0) {
    local_1d4 = (uint)(ushort)(short)in_RDI[0x16];
  }
  in_RDI[10] = local_1e4 + local_1d4;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncFrame::finalize() noexcept {
  if (!Environment::isValidArch(arch()))
    return DebugUtils::errored(kErrorInvalidArch);

  const ArchTraits& archTraits = ArchTraits::byArch(arch());

  uint32_t registerSize = _saveRestoreRegSize[RegGroup::kGp];
  uint32_t vectorSize = _saveRestoreRegSize[RegGroup::kVec];
  uint32_t returnAddressSize = archTraits.hasLinkReg() ? 0u : registerSize;

  // The final stack alignment must be updated accordingly to call and local stack alignments.
  uint32_t stackAlignment = _finalStackAlignment;
  ASMJIT_ASSERT(stackAlignment == Support::max(_naturalStackAlignment,
                                               _callStackAlignment,
                                               _localStackAlignment));

  bool hasFP = hasPreservedFP();
  bool hasDA = hasDynamicAlignment();

  uint32_t kSp = archTraits.spRegId();
  uint32_t kFp = archTraits.fpRegId();
  uint32_t kLr = archTraits.linkRegId();

  // Make frame pointer dirty if the function uses it.
  if (hasFP) {
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kFp);

    // Currently required by ARM, if this works differently across architectures we would have to generalize most
    // likely in CallConv.
    if (kLr != BaseReg::kIdBad)
      _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kLr);
  }

  // These two are identical if the function doesn't align its stack dynamically.
  uint32_t saRegId = _saRegId;
  if (saRegId == BaseReg::kIdBad)
    saRegId = kSp;

  // Fix stack arguments base-register from SP to FP in case it was not picked before and the function performs
  // dynamic stack alignment.
  if (hasDA && saRegId == kSp)
    saRegId = kFp;

  // Mark as dirty any register but SP if used as SA pointer.
  if (saRegId != kSp)
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(saRegId);

  _spRegId = uint8_t(kSp);
  _saRegId = uint8_t(saRegId);

  // Setup stack size used to save preserved registers.
  uint32_t saveRestoreSizes[2] {};
  for (RegGroup group : RegGroupVirtValues{})
    saveRestoreSizes[size_t(!archTraits.hasInstPushPop(group))]
      += Support::alignUp(Support::popcnt(savedRegs(group)) * saveRestoreRegSize(group), saveRestoreAlignment(group));

  _pushPopSaveSize  = uint16_t(saveRestoreSizes[0]);
  _extraRegSaveSize = uint16_t(saveRestoreSizes[1]);

  uint32_t v = 0;                            // The beginning of the stack frame relative to SP after prolog.
  v += callStackSize();                      // Count 'callStackSize'      <- This is used to call functions.
  v  = Support::alignUp(v, stackAlignment);  // Align to function's stack alignment.

  _localStackOffset = v;                     // Store 'localStackOffset'   <- Function's local stack starts here.
  v += localStackSize();                     // Count 'localStackSize'     <- Function's local stack ends here.

  // If the function's stack must be aligned, calculate the alignment necessary to store vector registers, and set
  // `FuncAttributes::kAlignedVecSR` to inform PEI that it can use instructions that perform aligned stores/loads.
  if (stackAlignment >= vectorSize && _extraRegSaveSize) {
    addAttributes(FuncAttributes::kAlignedVecSR);
    v = Support::alignUp(v, vectorSize);     // Align 'extraRegSaveOffset'.
  }

  _extraRegSaveOffset = v;                   // Store 'extraRegSaveOffset' <- Non-GP save/restore starts here.
  v += _extraRegSaveSize;                    // Count 'extraRegSaveSize'   <- Non-GP save/restore ends here.

  // Calculate if dynamic alignment (DA) slot (stored as offset relative to SP) is required and its offset.
  if (hasDA && !hasFP) {
    _daOffset = v;                           // Store 'daOffset'           <- DA pointer would be stored here.
    v += registerSize;                       // Count 'daOffset'.
  }
  else {
    _daOffset = FuncFrame::kTagInvalidOffset;
  }

  // Link Register
  // -------------
  //
  // The stack is aligned after the function call as the return address is stored in a link register. Some
  // architectures may require to always have aligned stack after PUSH/POP operation, which is represented
  // by ArchTraits::stackAlignmentConstraint().
  //
  // No Link Register (X86/X64)
  // --------------------------
  //
  // The return address should be stored after GP save/restore regs. It has the same size as `registerSize`
  // (basically the native register/pointer size). We don't adjust it now as `v` now contains the exact size
  // that the function requires to adjust (call frame + stack frame, vec stack size). The stack (if we consider
  // this size) is misaligned now, as it's always aligned before the function call - when `call()` is executed
  // it pushes the current EIP|RIP onto the stack, and misaligns it by 12 or 8 bytes (depending on the
  // architecture). So count number of bytes needed to align it up to the function's CallFrame (the beginning).
  if (v || hasFuncCalls() || !returnAddressSize)
    v += Support::alignUpDiff(v + pushPopSaveSize() + returnAddressSize, stackAlignment);

  _pushPopSaveOffset = v;                    // Store 'pushPopSaveOffset'  <- Function's push/pop save/restore starts here.
  _stackAdjustment = v;                      // Store 'stackAdjustment'    <- SA used by 'add SP, SA' and 'sub SP, SA'.
  v += _pushPopSaveSize;                     // Count 'pushPopSaveSize'    <- Function's push/pop save/restore ends here.
  _finalStackSize = v;                       // Store 'finalStackSize'     <- Final stack used by the function.

  if (!archTraits.hasLinkReg())
    v += registerSize;                       // Count 'ReturnAddress'      <- As CALL pushes onto stack.

  // If the function performs dynamic stack alignment then the stack-adjustment must be aligned.
  if (hasDA)
    _stackAdjustment = Support::alignUp(_stackAdjustment, stackAlignment);

  // Calculate where the function arguments start relative to SP.
  _saOffsetFromSP = hasDA ? FuncFrame::kTagInvalidOffset : v;

  // Calculate where the function arguments start relative to FP or user-provided register.
  _saOffsetFromSA = hasFP ? returnAddressSize + registerSize      // Return address + frame pointer.
                          : returnAddressSize + _pushPopSaveSize; // Return address + all push/pop regs.

  return kErrorOk;
}